

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.h
# Opt level: O3

void __thiscall
Js::DynamicTypeHandler::SetHasOnlyWritableDataProperties(DynamicTypeHandler *this,bool value)

{
  uint uVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  
  bVar3 = GetPropertyTypes(this);
  uVar1._0_1_ = this->propertyTypes;
  uVar1._1_1_ = this->flags;
  uVar1._2_2_ = this->offsetOfInlineSlots;
  uVar6 = (uint)((undefined1)uVar1 ^ 0x10);
  if ((bool)((bVar3 & 0x10) >> 4) == value) {
    uVar6 = uVar1;
  }
  this->propertyTypes = (byte)uVar6 | 0x20;
  if ((uVar6 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x1a1,"((propertyTypes & 0x01) != 0)",
                                "(propertyTypes & PropertyTypesReserved) != 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void SetHasOnlyWritableDataProperties(bool value)
        {
            if (value != GetHasOnlyWritableDataProperties())
            {
                propertyTypes ^= PropertyTypesWritableDataOnly;
            }

            // Turn on the detection bit.
            propertyTypes |= PropertyTypesWritableDataOnlyDetection;
            Assert((propertyTypes & PropertyTypesReserved) != 0);
        }